

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# impl_dispatch_test.cc
# Opt level: O0

void __thiscall
ImplDispatchTest_AES_set_encrypt_key_Test::~ImplDispatchTest_AES_set_encrypt_key_Test
          (ImplDispatchTest_AES_set_encrypt_key_Test *this)

{
  ImplDispatchTest_AES_set_encrypt_key_Test *this_local;
  
  ~ImplDispatchTest_AES_set_encrypt_key_Test(this);
  operator_delete(this,0x18);
  return;
}

Assistant:

TEST_F(ImplDispatchTest, AES_set_encrypt_key) {
  AssertFunctionsHit(
      {
          {kFlag_aes_hw_set_encrypt_key, aesni_},
          {kFlag_vpaes_set_encrypt_key, ssse3_ && !aesni_},
      },
      [] {
        AES_KEY key;
        static const uint8_t kZeros[16] = {0};
        AES_set_encrypt_key(kZeros, sizeof(kZeros) * 8, &key);
      });
}